

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BrepFace * __thiscall ON_BrepFace::operator=(ON_BrepFace *this,ON_BrepFace *src)

{
  Impl *pIVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  int iVar6;
  ON_Mesh *__tmp;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  recursive_mutex *__mutex;
  recursive_mutex *__mutex_00;
  
  if (src != this) {
    ON_SurfaceProxy::operator=(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
    this->m_face_user = src->m_face_user;
    this->m_status = src->m_status;
    this->m_face_index = src->m_face_index;
    ON_SimpleArray<int>::operator=(&this->m_li,&src->m_li);
    this->m_si = src->m_si;
    this->m_bRev = src->m_bRev;
    this->m_face_material_channel = src->m_face_material_channel;
    uVar4 = (src->m_face_uuid).Data2;
    uVar5 = (src->m_face_uuid).Data3;
    uVar3 = *(undefined8 *)(src->m_face_uuid).Data4;
    (this->m_face_uuid).Data1 = (src->m_face_uuid).Data1;
    (this->m_face_uuid).Data2 = uVar4;
    (this->m_face_uuid).Data3 = uVar5;
    *(undefined8 *)(this->m_face_uuid).Data4 = uVar3;
    (this->m_per_face_color).field_0 = (src->m_per_face_color).field_0;
    __mutex = &this->m_pImpl->m_mesh_mutex;
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    __mutex_00 = &src->m_pImpl->m_mesh_mutex;
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    peVar7 = (src->m_pImpl->m_render_mesh).
             super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar7 == (element_type *)0x0) {
      peVar7 = (element_type *)0x0;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var8 = (src->m_pImpl->m_render_mesh).
               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
    }
    pIVar1 = this->m_pImpl;
    (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar7;
    p_Var2 = (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar7 = (src->m_pImpl->m_analysis_mesh).
             super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar7 == (element_type *)0x0) {
      peVar7 = (element_type *)0x0;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var8 = (src->m_pImpl->m_analysis_mesh).
               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
    }
    pIVar1 = this->m_pImpl;
    (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar7;
    p_Var2 = (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar7 = (src->m_pImpl->m_preview_mesh).
             super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar7 == (element_type *)0x0) {
      peVar7 = (element_type *)0x0;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var8 = (src->m_pImpl->m_preview_mesh).
               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
    }
    pIVar1 = this->m_pImpl;
    (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar7;
    p_Var2 = (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return this;
}

Assistant:

ON_BrepFace& ON_BrepFace::operator=(const ON_BrepFace& src)
{
  if ( &src != this ) 
  {
    // do not copy m_brep pointer
    ON_SurfaceProxy::operator=(src);
    m_face_user   = src.m_face_user;
    m_status      = src.m_status;
    m_face_index  = src.m_face_index;
    m_li    = src.m_li;
    m_si    = src.m_si;
    m_bRev  = src.m_bRev;
    m_face_material_channel = src.m_face_material_channel;
    m_face_uuid = src.m_face_uuid;
    m_per_face_color = src.m_per_face_color;

    std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);
    std::lock_guard<std::recursive_mutex> lock2(src.m_pImpl->m_mesh_mutex);

    m_pImpl->m_render_mesh   = src.m_pImpl->m_render_mesh   ? src.m_pImpl->m_render_mesh   : nullptr;
    m_pImpl->m_analysis_mesh = src.m_pImpl->m_analysis_mesh ? src.m_pImpl->m_analysis_mesh : nullptr;
    m_pImpl->m_preview_mesh  = src.m_pImpl->m_preview_mesh  ? src.m_pImpl->m_preview_mesh  : nullptr;
  }
  return *this;
}